

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

_Bool Hacl_P256_ecdsa_verif_without_hash
                (uint32_t msg_len,uint8_t *msg,uint8_t *public_key,uint8_t *signature_r,
                uint8_t *signature_s)

{
  _Bool _Var1;
  _Bool res;
  uint8_t *mHash32;
  uint8_t mHash [32];
  uint64_t m_q [4];
  uint8_t *signature_s_local;
  uint8_t *signature_r_local;
  uint8_t *public_key_local;
  uint8_t *msg_local;
  uint32_t msg_len_local;
  
  memset(mHash + 0x18,0,0x20);
  memset(&mHash32,0,0x20);
  mHash32 = *(uint8_t **)msg;
  mHash._0_8_ = *(undefined8 *)(msg + 8);
  mHash._8_8_ = *(undefined8 *)(msg + 0x10);
  mHash._16_8_ = *(undefined8 *)(msg + 0x18);
  bn_from_bytes_be4((uint64_t *)(mHash + 0x18),(uint8_t *)&mHash32);
  qmod_short((uint64_t *)(mHash + 0x18),(uint64_t *)(mHash + 0x18));
  _Var1 = ecdsa_verify_msg_as_qelem((uint64_t *)(mHash + 0x18),public_key,signature_r,signature_s);
  return _Var1;
}

Assistant:

bool
Hacl_P256_ecdsa_verif_without_hash(
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[32U] = { 0U };
  memcpy(mHash, msg, 32U * sizeof (uint8_t));
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_verify_msg_as_qelem(m_q, public_key, signature_r, signature_s);
  return res;
}